

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTimestepperHHT.cpp
# Opt level: O3

void __thiscall chrono::ChTimestepperHHT::ArchiveIN(ChTimestepperHHT *this)

{
  ChArchiveIn *in_RSI;
  
  ArchiveIN((ChTimestepperHHT *)
            &this[-1].Rold.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows,in_RSI);
  return;
}

Assistant:

void ChTimestepperHHT::ArchiveIN(ChArchiveIn& archive) {
    // version number
    /*int version =*/ archive.VersionRead<ChTimestepperHHT>();
    // deserialize parent class:
    ChTimestepperIIorder::ArchiveIN(archive);
    ChImplicitIterativeTimestepper::ArchiveIN(archive);
    // stream in all member data:
    archive >> CHNVP(alpha);
    archive >> CHNVP(beta);
    archive >> CHNVP(gamma);
    archive >> CHNVP(scaling);
    my_enum_mappers::HHT_Mode_mapper modemapper;
    archive >> CHNVP(modemapper(mode), "mode");
}